

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_protozero::const_fixed_iterator<unsigned_int>_&,_const_protozero::const_fixed_iterator<unsigned_int>_&>
* __thiscall
Catch::ExprLhs<protozero::const_fixed_iterator<unsigned_int>const&>::operator!=
          (BinaryExpr<const_protozero::const_fixed_iterator<unsigned_int>_&,_const_protozero::const_fixed_iterator<unsigned_int>_&>
           *__return_storage_ptr__,
          ExprLhs<protozero::const_fixed_iterator<unsigned_int>const&> *this,
          const_fixed_iterator<unsigned_int> *rhs)

{
  const_fixed_iterator<unsigned_int> *lhs;
  bool comparisonResult;
  StringRef local_30;
  const_fixed_iterator<unsigned_int> *local_20;
  const_fixed_iterator<unsigned_int> *rhs_local;
  ExprLhs<const_protozero::const_fixed_iterator<unsigned_int>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (const_fixed_iterator<unsigned_int> *)this;
  this_local = (ExprLhs<const_protozero::const_fixed_iterator<unsigned_int>_&> *)
               __return_storage_ptr__;
  comparisonResult =
       compareNotEqual<protozero::const_fixed_iterator<unsigned_int>,protozero::const_fixed_iterator<unsigned_int>const&>
                 (*(const_fixed_iterator<unsigned_int> **)this,rhs);
  lhs = *(const_fixed_iterator<unsigned_int> **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_protozero::const_fixed_iterator<unsigned_int>_&,_const_protozero::const_fixed_iterator<unsigned_int>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }